

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassembler.cpp
# Opt level: O0

void __thiscall LLVMBC::StreamState::append(StreamState *this,Function *func,bool decl)

{
  Function *this_00;
  bool bVar1;
  uint uVar2;
  uint uVar3;
  String *pSVar4;
  Type *type_00;
  BasicBlock *bb_00;
  BasicBlock *bb;
  IteratorAdaptor<LLVMBC::BasicBlock,___gnu_cxx::__normal_iterator<LLVMBC::BasicBlock_*const_*,_std::vector<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>_>_>
  __end3;
  IteratorAdaptor<LLVMBC::BasicBlock,___gnu_cxx::__normal_iterator<LLVMBC::BasicBlock_*const_*,_std::vector<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>_>_>
  __begin3;
  Function *__range3;
  __normal_iterator<LLVMBC::BasicBlock_*const_*,_std::vector<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>_>
  local_40;
  uint local_34;
  FunctionType *pFStack_30;
  uint i;
  FunctionType *type;
  undefined1 local_19;
  Function *pFStack_18;
  bool decl_local;
  Function *func_local;
  StreamState *this_local;
  
  local_19 = decl;
  pFStack_18 = func;
  func_local = (Function *)this;
  if (decl) {
    type = (FunctionType *)Value::getType((Value *)func);
    pSVar4 = Function::getName_abi_cxx11_(pFStack_18);
    append<char_const(&)[8],LLVMBC::Type*,char_const(&)[3],std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>const&,char_const(&)[2]>
              (this,(char (*) [8])"define ",(Type **)&type,(char (*) [3])" @",pSVar4,
               (char (*) [2])0x2a8f67);
    pFStack_30 = Function::getFunctionType(pFStack_18);
    for (local_34 = 0; uVar3 = local_34, uVar2 = FunctionType::getNumParams(pFStack_30),
        uVar3 < uVar2; local_34 = local_34 + 1) {
      type_00 = FunctionType::getParamType(pFStack_30,local_34);
      append(this,type_00);
      uVar3 = local_34 + 1;
      uVar2 = FunctionType::getNumParams(pFStack_30);
      if (uVar3 < uVar2) {
        append(this,", ");
      }
    }
    append(this,")");
    local_40._M_current = (BasicBlock **)Function::begin(pFStack_18);
    __range3 = (Function *)Function::end(pFStack_18);
    bVar1 = IteratorAdaptor<LLVMBC::BasicBlock,___gnu_cxx::__normal_iterator<LLVMBC::BasicBlock_*const_*,_std::vector<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>_>_>
            ::operator!=((IteratorAdaptor<LLVMBC::BasicBlock,___gnu_cxx::__normal_iterator<LLVMBC::BasicBlock_*const_*,_std::vector<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>_>_>
                          *)&local_40,
                         (IteratorAdaptor<LLVMBC::BasicBlock,___gnu_cxx::__normal_iterator<LLVMBC::BasicBlock_*const_*,_std::vector<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>_>_>
                          *)&__range3);
    if (bVar1) {
      begin_scope(this);
      this_00 = pFStack_18;
      __end3 = Function::begin(pFStack_18);
      bb = (BasicBlock *)Function::end(this_00);
      while (bVar1 = IteratorAdaptor<LLVMBC::BasicBlock,___gnu_cxx::__normal_iterator<LLVMBC::BasicBlock_*const_*,_std::vector<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>_>_>
                     ::operator!=(&__end3,(IteratorAdaptor<LLVMBC::BasicBlock,___gnu_cxx::__normal_iterator<LLVMBC::BasicBlock_*const_*,_std::vector<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>_>_>
                                           *)&bb), bVar1) {
        bb_00 = IteratorAdaptor<LLVMBC::BasicBlock,___gnu_cxx::__normal_iterator<LLVMBC::BasicBlock_*const_*,_std::vector<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>_>_>
                ::operator*(&__end3);
        append(this,bb_00,true);
        IteratorAdaptor<LLVMBC::BasicBlock,___gnu_cxx::__normal_iterator<LLVMBC::BasicBlock_*const_*,_std::vector<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>_>_>
        ::operator++(&__end3);
      }
      end_scope(this);
    }
  }
  else {
    pSVar4 = Function::getName_abi_cxx11_(func);
    append<char_const(&)[2],std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>const&>
              (this,(char (*) [2])0x2a9093,pSVar4);
  }
  return;
}

Assistant:

void StreamState::append(Function *func, bool decl)
{
	if (decl)
	{
		append("define ", func->getType(), " @", func->getName(), "(");
		auto *type = func->getFunctionType();
		for (unsigned i = 0; i < type->getNumParams(); i++)
		{
			append(type->getParamType(i));
			if (i + 1 < type->getNumParams())
				append(", ");
		}
		append(")");

		if (func->begin() != func->end())
		{
			begin_scope();
			for (auto &bb : *func)
				append(&bb, true);
			end_scope();
		}
	}
	else
		append("@", func->getName());
}